

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O1

level_enum spdlog::level::from_str(string *name)

{
  pointer __s2;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong __n;
  level_enum unaff_EBP;
  level_enum lVar4;
  long lVar5;
  level_enum lVar6;
  bool bVar7;
  bool bVar8;
  
  __s2 = (name->_M_dataplus)._M_p;
  uVar1 = name->_M_string_length;
  bVar8 = false;
  lVar5 = 8;
  lVar6 = trace;
  do {
    uVar2 = *(ulong *)((long)&level_string_views + lVar5);
    __n = uVar1;
    if (uVar2 < uVar1) {
      __n = uVar2;
    }
    if (__n == 0) {
      bVar7 = true;
    }
    else {
      iVar3 = bcmp(*(void **)(lVar5 + 0x1b8678),__s2,__n);
      bVar7 = iVar3 == 0;
    }
    lVar4 = lVar6;
    if ((bool)(uVar2 == uVar1 & bVar7)) break;
    lVar6 = lVar6 + debug;
    lVar5 = lVar5 + 0x10;
    bVar8 = lVar5 == 0x78;
    lVar4 = unaff_EBP;
  } while (!bVar8);
  if (bVar8) {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      lVar4 = warn;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)name);
      lVar4 = (uint)(iVar3 != 0) * 2 + err;
    }
  }
  return lVar4;
}

Assistant:

SPDLOG_INLINE spdlog::level::level_enum from_str(const std::string &name) SPDLOG_NOEXCEPT
{
    int level = 0;
    for (const auto &level_str : level_string_views)
    {
        if (level_str == name)
        {
            return static_cast<level::level_enum>(level);
        }
        level++;
    }
    // check also for "warn" and "err" before giving up..
    if (name == "warn")
    {
        return level::warn;
    }
    if (name == "err")
    {
        return level::err;
    }
    return level::off;
}